

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

string * __thiscall
lest::make_string<int,double>(string *__return_storage_ptr__,lest *this,pair<int,_double> *pair)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  ostringstream oss;
  string local_208;
  pointer local_1e8;
  size_type local_1e0;
  char local_1d8 [8];
  undefined8 uStack_1d0;
  pointer local_1c8;
  size_type local_1c0;
  char local_1b8 [8];
  undefined8 uStack_1b0;
  double local_1a8;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"{ ",2);
  local_1e8 = (pointer)CONCAT44(local_1e8._4_4_,*(undefined4 *)this);
  make_value_string<int>(&local_208,(int *)&local_1e8);
  paVar1 = &local_208.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p == paVar1) {
    uStack_1b0 = local_208.field_2._8_8_;
    local_1c8 = local_1b8;
  }
  else {
    local_1c8 = local_208._M_dataplus._M_p;
  }
  local_1c0 = local_208._M_string_length;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_1c8,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  local_1a8 = *(double *)(this + 8);
  make_value_string<double>(&local_208,&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p == paVar1) {
    uStack_1d0 = local_208.field_2._8_8_;
    local_1e8 = local_1d8;
  }
  else {
    local_1e8 = local_208._M_dataplus._M_p;
  }
  local_1e0 = local_208._M_string_length;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1e8,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," }",2);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_208.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_208.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_208._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_208.field_2._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = local_208._M_string_length;
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

auto make_string( std::pair<T1,T2> const & pair ) -> std::string
{
    std::ostringstream oss;
    oss << "{ " << to_string( pair.first ) << ", " << to_string( pair.second ) << " }";
    return oss.str();
}